

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_grouping.cpp
# Opt level: O0

Grouper icu_63::number::impl::Grouper::forStrategy(UGroupingStrategy grouping)

{
  Grouper GVar1;
  undefined1 auStack_14 [4];
  UGroupingStrategy grouping_local;
  UNumberGroupingStrategy local_c;
  
  switch(grouping) {
  case UNUM_GROUPING_OFF:
    Grouper((Grouper *)auStack_14,-1,-1,-2,grouping);
    break;
  case UNUM_GROUPING_MIN2:
    Grouper((Grouper *)auStack_14,-2,-2,-3,grouping);
    break;
  case UNUM_GROUPING_AUTO:
    Grouper((Grouper *)auStack_14,-2,-2,-2,grouping);
    break;
  case UNUM_GROUPING_ON_ALIGNED:
    Grouper((Grouper *)auStack_14,-4,-4,1,grouping);
    break;
  case UNUM_GROUPING_THOUSANDS:
    Grouper((Grouper *)auStack_14,3,3,1,grouping);
    break;
  default:
    Grouper((Grouper *)auStack_14);
  }
  GVar1.fStrategy = local_c;
  GVar1.fGrouping1 = auStack_14._0_2_;
  GVar1.fGrouping2 = auStack_14._2_2_;
  GVar1.fMinGrouping = (undefined2)grouping_local;
  GVar1._6_2_ = grouping_local._2_2_;
  return GVar1;
}

Assistant:

Grouper Grouper::forStrategy(UGroupingStrategy grouping) {
    switch (grouping) {
    case UNUM_GROUPING_OFF:
        return {-1, -1, -2, grouping};
    case UNUM_GROUPING_AUTO:
        return {-2, -2, -2, grouping};
    case UNUM_GROUPING_MIN2:
        return {-2, -2, -3, grouping};
    case UNUM_GROUPING_ON_ALIGNED:
        return {-4, -4, 1, grouping};
    case UNUM_GROUPING_THOUSANDS:
        return {3, 3, 1, grouping};
    default:
        U_ASSERT(FALSE);
        return {}; // return a value: silence compiler warning
    }
}